

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitSectors.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::track_for_sectors
          (Disk *this,uint8_t *source,int number_of_sectors,uint8_t track,uint8_t side,
          uint8_t first_sector,uint8_t size,Density density)

{
  bool bVar1;
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  reference this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Storage::Disk::Track> sVar2;
  optional<unsigned_long> sector_gap_length;
  optional<unsigned_char> local_93;
  _Storage<unsigned_long,_true> local_90;
  optional<unsigned_char> local_88;
  uchar *local_80;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_78;
  const_iterator local_70;
  reference local_68;
  Sector *new_sector;
  int local_4c;
  long lStack_48;
  int sector;
  size_t source_pointer;
  size_t byte_size;
  vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_> sectors;
  uint8_t first_sector_local;
  uint8_t side_local;
  uint8_t track_local;
  int number_of_sectors_local;
  uint8_t *source_local;
  
  sectors.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ = first_sector;
  sectors.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = side;
  sectors.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = track;
  sectors.
  super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = number_of_sectors;
  std::vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>::
  vector((vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
          *)&byte_size);
  source_pointer = (size_t)(0x80 << (size & 0x1f));
  lStack_48 = 0;
  for (local_4c = 0;
      local_4c <
      sectors.
      super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_4c = local_4c + 1) {
    std::vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>::
    emplace_back<>((vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
                    *)&byte_size);
    local_68 = std::
               vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
               ::back((vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
                       *)&byte_size);
    (local_68->address).track =
         sectors.
         super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_;
    (local_68->address).side =
         sectors.
         super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_;
    (local_68->address).sector =
         sectors.
         super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_;
    sectors.
    super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ =
         sectors.
         super__Vector_base<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ + '\x01';
    local_68->size = size;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::emplace_back<>(&local_68->samples);
    this_00 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
              std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator[](&local_68->samples,0);
    this_01 = std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::operator[](&local_68->samples,0);
    local_78._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(this_01);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_70,&local_78);
    local_80 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<unsigned_char_const*,void>
                                  (this_00,local_70,source + lStack_48,
                                   source + lStack_48 + source_pointer);
    lStack_48 = source_pointer + lStack_48;
  }
  bVar1 = std::
          vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
          ::empty((vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
                   *)&byte_size);
  if (bVar1) {
    std::shared_ptr<Storage::Disk::Track>::shared_ptr
              ((shared_ptr<Storage::Disk::Track> *)this,(nullptr_t)0x0);
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_90);
    std::optional<unsigned_char>::optional(&local_93);
    sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._8_8_ = local_90._M_value;
    sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)&byte_size;
    Encodings::MFM::TrackWithSectors
              ((Density)this,
               (vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
                *)(ulong)density,sector_gap_length,local_88);
  }
  std::vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>::
  ~vector((vector<Storage::Encodings::MFM::Sector,_std::allocator<Storage::Encodings::MFM::Sector>_>
           *)&byte_size);
  sVar2.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar2.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> Storage::Disk::track_for_sectors(
	const uint8_t *const source,
	int number_of_sectors,
	uint8_t track,
	uint8_t side,
	uint8_t first_sector,
	uint8_t size,
	Storage::Encodings::MFM::Density density
) {
	std::vector<Storage::Encodings::MFM::Sector> sectors;

	size_t byte_size = size_t(128 << size);
	size_t source_pointer = 0;
	for(int sector = 0; sector < number_of_sectors; sector++) {
		sectors.emplace_back();

		Storage::Encodings::MFM::Sector &new_sector = sectors.back();
		new_sector.address.track = track;
		new_sector.address.side = side;
		new_sector.address.sector = first_sector;
		first_sector++;
		new_sector.size = size;

		new_sector.samples.emplace_back();
		new_sector.samples[0].insert(new_sector.samples[0].begin(), source + source_pointer, source + source_pointer + byte_size);
		source_pointer += byte_size;
	}

	if(!sectors.empty()) {
		return TrackWithSectors(density, sectors);
	}

	return nullptr;
}